

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_getlocal(lua_State *L)

{
  int32_t n;
  int32_t level;
  int iVar1;
  lua_State *L_00;
  char *pcVar2;
  int arg;
  lua_Debug ar;
  
  L_00 = getthread(L,&arg);
  n = lj_lib_checkint(L,arg + 2);
  if (L->base[arg].field_4.it >> 0xf == 0x1fff7) {
    L->top = L->base + (long)arg + 1;
    pcVar2 = lua_getlocal(L,(lua_Debug *)0x0,n);
    lua_pushstring(L,pcVar2);
  }
  else {
    level = lj_lib_checkint(L,arg + 1);
    iVar1 = lua_getstack(L_00,level,&ar);
    if (iVar1 == 0) {
      lj_err_arg(L,arg + 1,LJ_ERR_LVLRNG);
    }
    pcVar2 = lua_getlocal(L_00,&ar,n);
    if (pcVar2 != (char *)0x0) {
      lua_xmove(L_00,L,1);
      lua_pushstring(L,pcVar2);
      lua_pushvalue(L,-2);
      return 2;
    }
    L->top[-1].u64 = 0xffffffffffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_getlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int slot = lj_lib_checkint(L, arg+2);
  if (tvisfunc(L->base+arg)) {
    L->top = L->base+arg+1;
    lua_pushstring(L, lua_getlocal(L, NULL, slot));
    return 1;
  }
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  name = lua_getlocal(L1, &ar, slot);
  if (name) {
    lua_xmove(L1, L, 1);
    lua_pushstring(L, name);
    lua_pushvalue(L, -2);
    return 2;
  } else {
    setnilV(L->top-1);
    return 1;
  }
}